

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

string * poplar::
         short_realname<poplar::map<poplar::plain_fkhash_trie<90u,poplar::hash::vigna_hasher>,poplar::plain_fkhash_nlm<int>>>
                   (void)

{
  string *in_RDI;
  string *name;
  string *this;
  string local_80 [4];
  flag_type in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  match_flag_type in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  realname<poplar::map<poplar::plain_fkhash_trie<90u,poplar::hash::vigna_hasher>,poplar::plain_fkhash_nlm<int>>>
            ();
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,in_stack_ffffffffffffff84);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94);
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,in_stack_ffffffffffffff84);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94);
  std::__cxx11::string::operator=((string *)this,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this);
  return in_RDI;
}

Assistant:

inline std::string short_realname() {
    auto name = realname<T>();
    name = std::regex_replace(name, std::regex{R"( |poplar::)"}, "");
    name = std::regex_replace(name, std::regex{R"((\d+)ul{0,2})"}, "$1");
    return name;
}